

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:2114:5)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:2114:5)>
      *this)

{
  PromiseNode *pPVar1;
  StringPtr expected;
  Own<kj::_::PromiseNode> local_188;
  ExceptionOrValue local_178;
  char local_18;
  
  expected.content.size_ = (size_t)"o";
  expected.content.ptr = (char *)((this->func).right)->ptr;
  kj::anon_unknown_0::expectRead((AsyncInputStream *)&local_188,expected);
  local_178.exception.ptr.isSet = false;
  local_18 = '\0';
  waitImpl(&local_188,&local_178,(this->func).ws);
  if (local_18 == '\x01') {
    if (local_178.exception.ptr.isSet != false) {
      throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_178.exception.ptr.isSet == false) {
      unreachable();
    }
    throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
  }
  if (local_178.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.exception.ptr.field_1.value);
  }
  pPVar1 = local_188.ptr;
  if (local_188.ptr != (PromiseNode *)0x0) {
    local_188.ptr = (PromiseNode *)0x0;
    (**(local_188.disposer)->_vptr_Disposer)
              (local_188.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  return;
}

Assistant:

void run() override {
    func();
  }